

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::ensureBufferCapacity(UnicodeSet *this,int32_t newLen,UErrorCode *ec)

{
  UChar32 *pUVar1;
  
  if ((this->buffer == (UChar32 *)0x0) || (this->bufferCapacity < newLen)) {
    pUVar1 = (UChar32 *)uprv_realloc_63(this->buffer,(long)newLen * 4 + 0x40);
    if (pUVar1 == (UChar32 *)0x0) {
      *ec = U_MEMORY_ALLOCATION_ERROR;
      clear(this);
      this->fFlags = '\x01';
    }
    else {
      this->buffer = pUVar1;
      this->bufferCapacity = newLen + 0x10;
    }
  }
  return;
}

Assistant:

void UnicodeSet::ensureBufferCapacity(int32_t newLen, UErrorCode& ec) {
    if (buffer != NULL && newLen <= bufferCapacity)
        return;
    UChar32* temp = (UChar32*) uprv_realloc(buffer, sizeof(UChar32) * (newLen + GROW_EXTRA));
    if (temp == NULL) {
        ec = U_MEMORY_ALLOCATION_ERROR;
        setToBogus();
        return;
    }
    buffer = temp;
    bufferCapacity = newLen + GROW_EXTRA;
    // else we keep the original contents on the memory failure.
}